

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O0

_Bool bson_iter_as_bool(bson_iter_t *iter)

{
  int32_t iVar1;
  int64_t iVar2;
  double dVar3;
  bson_iter_t *iter_local;
  
  if (iter != (bson_iter_t *)0x0) {
    switch(iter->raw[iter->type]) {
    case '\x01':
      dVar3 = bson_iter_double(iter);
      iter_local._7_1_ = dVar3 != 0.0;
      break;
    case '\x02':
      iter_local._7_1_ = true;
      break;
    default:
      iter_local._7_1_ = true;
      break;
    case '\x06':
    case '\n':
      iter_local._7_1_ = false;
      break;
    case '\b':
      iter_local._7_1_ = bson_iter_bool(iter);
      break;
    case '\x10':
      iVar1 = bson_iter_int32(iter);
      iter_local._7_1_ = iVar1 != 0;
      break;
    case '\x12':
      iVar2 = bson_iter_int64(iter);
      iter_local._7_1_ = iVar2 != 0;
    }
    return iter_local._7_1_;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x3b9,"bson_iter_as_bool","iter");
  abort();
}

Assistant:

bool
bson_iter_as_bool (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return !(bson_iter_double (iter) == 0.0);
   case BSON_TYPE_INT64:
      return !(bson_iter_int64 (iter) == 0);
   case BSON_TYPE_INT32:
      return !(bson_iter_int32 (iter) == 0);
   case BSON_TYPE_UTF8:
      return true;
   case BSON_TYPE_NULL:
   case BSON_TYPE_UNDEFINED:
      return false;
   default:
      return true;
   }
}